

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Accounts.cpp
# Opt level: O0

void __thiscall Accounts::AddCharacter(Accounts *this,string *username,string *character_name)

{
  Account local_e0;
  string local_88 [32];
  undefined1 local_68 [8];
  Account account;
  string *character_name_local;
  string *username_local;
  Accounts *this_local;
  
  account.m_characters.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = character_name;
  GetAccount((Account *)local_68,this,username);
  std::__cxx11::string::string(local_88,(string *)character_name);
  Account::AddCharacter((Account *)local_68,(string *)local_88);
  std::__cxx11::string::~string(local_88);
  Account::Account(&local_e0,(Account *)local_68);
  AddAccount(this,&local_e0);
  Account::~Account(&local_e0);
  Account::~Account((Account *)local_68);
  return;
}

Assistant:

void Accounts::AddCharacter(std::string username, std::string character_name) {
    Account account = GetAccount(username);
    account.AddCharacter(character_name);
    AddAccount(account);
}